

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

insert_result * __thiscall
crnlib::
hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::insert(insert_result *__return_storage_ptr__,
        hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        *this,uint *k,empty_type *v)

{
  bool bVar1;
  empty_type *v_local;
  uint *k_local;
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *this_local;
  insert_result *result;
  
  std::
  pair<crnlib::hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::iterator,_bool>
  ::
  pair<crnlib::hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::iterator,_bool,_true>
            (__return_storage_ptr__);
  bVar1 = insert_no_grow(this,__return_storage_ptr__,k,v);
  if (!bVar1) {
    grow(this);
    bVar1 = insert_no_grow(this,__return_storage_ptr__,k,v);
    if (!bVar1) {
      crnlib_fail("\"insert() failed\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                  ,0x204);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
        {
            insert_result result;
            if (!insert_no_grow(result, k, v))
            {
                grow();

                // This must succeed.
                if (!insert_no_grow(result, k, v))
                {
                    CRNLIB_FAIL("insert() failed");
                }
            }

            return result;
        }